

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O0

Music_Emu * new_spc_emu(void)

{
  Music_Emu *pMVar1;
  undefined8 local_20;
  Spc_Emu *in_stack_fffffffffffffff0;
  
  pMVar1 = (Music_Emu *)Gme_File::operator_new(0x9642ce);
  local_20 = (Music_Emu *)0x0;
  if (pMVar1 != (Music_Emu *)0x0) {
    Spc_Emu::Spc_Emu(in_stack_fffffffffffffff0);
    local_20 = pMVar1;
  }
  return local_20;
}

Assistant:

static Music_Emu* new_spc_emu () { return BLARGG_NEW Spc_Emu ; }